

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

Udata * luaS_newudata(lua_State *L,size_t s,int nuvalue)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Udata *pUVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar38;
  int iVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  long lVar39;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar61;
  undefined1 auVar59 [16];
  int iVar62;
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  int iVar80;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  long lVar42;
  
  uVar26 = 0x20;
  if (nuvalue != 0) {
    uVar26 = (long)nuvalue * 0x10 + 0x28;
  }
  if (s <= (uVar26 ^ 0x7fffffffffffffff)) {
    pUVar24 = (Udata *)luaC_newobj(L,7,uVar26 + s);
    pUVar24->len = s;
    pUVar24->nuvalue = (unsigned_short)nuvalue;
    pUVar24->metatable = (Table *)0x0;
    auVar23 = _DAT_0012d8e0;
    if (0 < nuvalue) {
      lVar25 = (ulong)(uint)nuvalue - 1;
      auVar28._8_4_ = (int)lVar25;
      auVar28._0_8_ = lVar25;
      auVar28._12_4_ = (int)((ulong)lVar25 >> 0x20);
      lVar25 = 0;
      auVar29 = auVar28;
      auVar41 = _DAT_0012d860;
      auVar43 = _DAT_0012d870;
      auVar44 = _DAT_0012d880;
      auVar45 = _DAT_0012d890;
      auVar46 = _DAT_0012d8a0;
      auVar47 = _DAT_0012d8b0;
      auVar48 = _DAT_0012d8c0;
      auVar49 = _DAT_0012d8d0;
      do {
        auVar59 = auVar28 ^ auVar23;
        auVar63 = auVar49 ^ auVar23;
        iVar38 = auVar59._0_4_;
        iVar76 = -(uint)(iVar38 < auVar63._0_4_);
        iVar40 = auVar59._4_4_;
        auVar65._4_4_ = -(uint)(iVar40 < auVar63._4_4_);
        iVar61 = auVar59._8_4_;
        iVar80 = -(uint)(iVar61 < auVar63._8_4_);
        iVar62 = auVar59._12_4_;
        auVar65._12_4_ = -(uint)(iVar62 < auVar63._12_4_);
        auVar59._4_4_ = iVar76;
        auVar59._0_4_ = iVar76;
        auVar59._8_4_ = iVar80;
        auVar59._12_4_ = iVar80;
        auVar59 = pshuflw(auVar29,auVar59,0xe8);
        auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar40);
        auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar62);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        auVar50 = pshuflw(in_XMM11,auVar64,0xe8);
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar63 = pshuflw(auVar59,auVar65,0xe8);
        auVar29._8_4_ = 0xffffffff;
        auVar29._0_8_ = 0xffffffffffffffff;
        auVar29._12_4_ = 0xffffffff;
        auVar29 = (auVar63 | auVar50 & auVar59) ^ auVar29;
        auVar29 = packssdw(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)pUVar24->uv + lVar25 + 8) = 0;
        }
        auVar50._4_4_ = iVar76;
        auVar50._0_4_ = iVar76;
        auVar50._8_4_ = iVar80;
        auVar50._12_4_ = iVar80;
        auVar65 = auVar64 & auVar50 | auVar65;
        auVar29 = packssdw(auVar65,auVar65);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29 ^ auVar63,auVar29 ^ auVar63);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._0_4_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[1].uv + lVar25 + -0x20) = 0;
        }
        auVar29 = auVar48 ^ auVar23;
        auVar51._0_4_ = -(uint)(iVar38 < auVar29._0_4_);
        auVar51._4_4_ = -(uint)(iVar40 < auVar29._4_4_);
        auVar51._8_4_ = -(uint)(iVar61 < auVar29._8_4_);
        auVar51._12_4_ = -(uint)(iVar62 < auVar29._12_4_);
        auVar66._4_4_ = auVar51._0_4_;
        auVar66._0_4_ = auVar51._0_4_;
        auVar66._8_4_ = auVar51._8_4_;
        auVar66._12_4_ = auVar51._8_4_;
        iVar76 = -(uint)(auVar29._4_4_ == iVar40);
        iVar80 = -(uint)(auVar29._12_4_ == iVar62);
        auVar10._4_4_ = iVar76;
        auVar10._0_4_ = iVar76;
        auVar10._8_4_ = iVar80;
        auVar10._12_4_ = iVar80;
        auVar77._4_4_ = auVar51._4_4_;
        auVar77._0_4_ = auVar51._4_4_;
        auVar77._8_4_ = auVar51._12_4_;
        auVar77._12_4_ = auVar51._12_4_;
        auVar29 = auVar10 & auVar66 | auVar77;
        auVar29 = packssdw(auVar29,auVar29);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29 ^ auVar1,auVar29 ^ auVar1);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[1].uv + lVar25 + -0x10) = 0;
        }
        auVar29 = pshufhw(auVar29,auVar66,0x84);
        auVar11._4_4_ = iVar76;
        auVar11._0_4_ = iVar76;
        auVar11._8_4_ = iVar80;
        auVar11._12_4_ = iVar80;
        auVar63 = pshufhw(auVar51,auVar11,0x84);
        auVar59 = pshufhw(auVar29,auVar77,0x84);
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        auVar30 = (auVar59 | auVar63 & auVar29) ^ auVar30;
        auVar29 = packssdw(auVar30,auVar30);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._0_4_ >> 0x18 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[1].uv + lVar25) = 0;
        }
        auVar29 = auVar47 ^ auVar23;
        auVar52._0_4_ = -(uint)(iVar38 < auVar29._0_4_);
        auVar52._4_4_ = -(uint)(iVar40 < auVar29._4_4_);
        auVar52._8_4_ = -(uint)(iVar61 < auVar29._8_4_);
        auVar52._12_4_ = -(uint)(iVar62 < auVar29._12_4_);
        auVar12._4_4_ = auVar52._0_4_;
        auVar12._0_4_ = auVar52._0_4_;
        auVar12._8_4_ = auVar52._8_4_;
        auVar12._12_4_ = auVar52._8_4_;
        auVar63 = pshuflw(auVar77,auVar12,0xe8);
        auVar31._0_4_ = -(uint)(auVar29._0_4_ == iVar38);
        auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar40);
        auVar31._8_4_ = -(uint)(auVar29._8_4_ == iVar61);
        auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar62);
        auVar67._4_4_ = auVar31._4_4_;
        auVar67._0_4_ = auVar31._4_4_;
        auVar67._8_4_ = auVar31._12_4_;
        auVar67._12_4_ = auVar31._12_4_;
        auVar29 = pshuflw(auVar31,auVar67,0xe8);
        auVar68._4_4_ = auVar52._4_4_;
        auVar68._0_4_ = auVar52._4_4_;
        auVar68._8_4_ = auVar52._12_4_;
        auVar68._12_4_ = auVar52._12_4_;
        auVar59 = pshuflw(auVar52,auVar68,0xe8);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29 & auVar63,(auVar59 | auVar29 & auVar63) ^ auVar2);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)pUVar24[2].uv + lVar25 + -0x28) = 0;
        }
        auVar13._4_4_ = auVar52._0_4_;
        auVar13._0_4_ = auVar52._0_4_;
        auVar13._8_4_ = auVar52._8_4_;
        auVar13._12_4_ = auVar52._8_4_;
        auVar68 = auVar67 & auVar13 | auVar68;
        auVar59 = packssdw(auVar68,auVar68);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29,auVar59 ^ auVar3);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._4_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[2].uv + lVar25 + -0x18) = 0;
        }
        auVar29 = auVar46 ^ auVar23;
        auVar53._0_4_ = -(uint)(iVar38 < auVar29._0_4_);
        auVar53._4_4_ = -(uint)(iVar40 < auVar29._4_4_);
        auVar53._8_4_ = -(uint)(iVar61 < auVar29._8_4_);
        auVar53._12_4_ = -(uint)(iVar62 < auVar29._12_4_);
        auVar69._4_4_ = auVar53._0_4_;
        auVar69._0_4_ = auVar53._0_4_;
        auVar69._8_4_ = auVar53._8_4_;
        auVar69._12_4_ = auVar53._8_4_;
        iVar76 = -(uint)(auVar29._4_4_ == iVar40);
        iVar80 = -(uint)(auVar29._12_4_ == iVar62);
        auVar14._4_4_ = iVar76;
        auVar14._0_4_ = iVar76;
        auVar14._8_4_ = iVar80;
        auVar14._12_4_ = iVar80;
        auVar78._4_4_ = auVar53._4_4_;
        auVar78._0_4_ = auVar53._4_4_;
        auVar78._8_4_ = auVar53._12_4_;
        auVar78._12_4_ = auVar53._12_4_;
        auVar29 = auVar14 & auVar69 | auVar78;
        auVar29 = packssdw(auVar29,auVar29);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29 ^ auVar4,auVar29 ^ auVar4);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)pUVar24[2].uv + lVar25 + -8) = 0;
        }
        auVar29 = pshufhw(auVar29,auVar69,0x84);
        auVar15._4_4_ = iVar76;
        auVar15._0_4_ = iVar76;
        auVar15._8_4_ = iVar80;
        auVar15._12_4_ = iVar80;
        auVar63 = pshufhw(auVar53,auVar15,0x84);
        auVar59 = pshufhw(auVar29,auVar78,0x84);
        auVar32._8_4_ = 0xffffffff;
        auVar32._0_8_ = 0xffffffffffffffff;
        auVar32._12_4_ = 0xffffffff;
        auVar32 = (auVar59 | auVar63 & auVar29) ^ auVar32;
        auVar29 = packssdw(auVar32,auVar32);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._6_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[2].uv + lVar25 + 8) = 0;
        }
        auVar29 = auVar45 ^ auVar23;
        auVar54._0_4_ = -(uint)(iVar38 < auVar29._0_4_);
        auVar54._4_4_ = -(uint)(iVar40 < auVar29._4_4_);
        auVar54._8_4_ = -(uint)(iVar61 < auVar29._8_4_);
        auVar54._12_4_ = -(uint)(iVar62 < auVar29._12_4_);
        auVar16._4_4_ = auVar54._0_4_;
        auVar16._0_4_ = auVar54._0_4_;
        auVar16._8_4_ = auVar54._8_4_;
        auVar16._12_4_ = auVar54._8_4_;
        auVar63 = pshuflw(auVar78,auVar16,0xe8);
        auVar33._0_4_ = -(uint)(auVar29._0_4_ == iVar38);
        auVar33._4_4_ = -(uint)(auVar29._4_4_ == iVar40);
        auVar33._8_4_ = -(uint)(auVar29._8_4_ == iVar61);
        auVar33._12_4_ = -(uint)(auVar29._12_4_ == iVar62);
        auVar70._4_4_ = auVar33._4_4_;
        auVar70._0_4_ = auVar33._4_4_;
        auVar70._8_4_ = auVar33._12_4_;
        auVar70._12_4_ = auVar33._12_4_;
        auVar29 = pshuflw(auVar33,auVar70,0xe8);
        auVar71._4_4_ = auVar54._4_4_;
        auVar71._0_4_ = auVar54._4_4_;
        auVar71._8_4_ = auVar54._12_4_;
        auVar71._12_4_ = auVar54._12_4_;
        auVar59 = pshuflw(auVar54,auVar71,0xe8);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar59 | auVar29 & auVar63) ^ auVar55;
        auVar59 = packssdw(auVar55,auVar55);
        auVar29 = packsswb(auVar29 & auVar63,auVar59);
        if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)pUVar24[3].uv + lVar25 + -0x20) = 0;
        }
        auVar17._4_4_ = auVar54._0_4_;
        auVar17._0_4_ = auVar54._0_4_;
        auVar17._8_4_ = auVar54._8_4_;
        auVar17._12_4_ = auVar54._8_4_;
        auVar71 = auVar70 & auVar17 | auVar71;
        auVar59 = packssdw(auVar71,auVar71);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar5,auVar59 ^ auVar5);
        auVar29 = packsswb(auVar29,auVar59);
        if ((auVar29._8_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[3].uv + lVar25 + -0x10) = 0;
        }
        auVar29 = auVar44 ^ auVar23;
        auVar56._0_4_ = -(uint)(iVar38 < auVar29._0_4_);
        auVar56._4_4_ = -(uint)(iVar40 < auVar29._4_4_);
        auVar56._8_4_ = -(uint)(iVar61 < auVar29._8_4_);
        auVar56._12_4_ = -(uint)(iVar62 < auVar29._12_4_);
        auVar72._4_4_ = auVar56._0_4_;
        auVar72._0_4_ = auVar56._0_4_;
        auVar72._8_4_ = auVar56._8_4_;
        auVar72._12_4_ = auVar56._8_4_;
        iVar76 = -(uint)(auVar29._4_4_ == iVar40);
        iVar80 = -(uint)(auVar29._12_4_ == iVar62);
        auVar18._4_4_ = iVar76;
        auVar18._0_4_ = iVar76;
        auVar18._8_4_ = iVar80;
        auVar18._12_4_ = iVar80;
        auVar79._4_4_ = auVar56._4_4_;
        auVar79._0_4_ = auVar56._4_4_;
        auVar79._8_4_ = auVar56._12_4_;
        auVar79._12_4_ = auVar56._12_4_;
        auVar29 = auVar18 & auVar72 | auVar79;
        auVar29 = packssdw(auVar29,auVar29);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29 ^ auVar6,auVar29 ^ auVar6);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)pUVar24[3].uv + lVar25) = 0;
        }
        auVar29 = pshufhw(auVar29,auVar72,0x84);
        auVar19._4_4_ = iVar76;
        auVar19._0_4_ = iVar76;
        auVar19._8_4_ = iVar80;
        auVar19._12_4_ = iVar80;
        auVar63 = pshufhw(auVar56,auVar19,0x84);
        auVar59 = pshufhw(auVar29,auVar79,0x84);
        auVar34._8_4_ = 0xffffffff;
        auVar34._0_8_ = 0xffffffffffffffff;
        auVar34._12_4_ = 0xffffffff;
        auVar34 = (auVar59 | auVar63 & auVar29) ^ auVar34;
        auVar29 = packssdw(auVar34,auVar34);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._10_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[4].uv + lVar25 + -0x28) = 0;
        }
        auVar29 = auVar43 ^ auVar23;
        auVar57._0_4_ = -(uint)(iVar38 < auVar29._0_4_);
        auVar57._4_4_ = -(uint)(iVar40 < auVar29._4_4_);
        auVar57._8_4_ = -(uint)(iVar61 < auVar29._8_4_);
        auVar57._12_4_ = -(uint)(iVar62 < auVar29._12_4_);
        auVar20._4_4_ = auVar57._0_4_;
        auVar20._0_4_ = auVar57._0_4_;
        auVar20._8_4_ = auVar57._8_4_;
        auVar20._12_4_ = auVar57._8_4_;
        auVar63 = pshuflw(auVar79,auVar20,0xe8);
        auVar35._0_4_ = -(uint)(auVar29._0_4_ == iVar38);
        auVar35._4_4_ = -(uint)(auVar29._4_4_ == iVar40);
        auVar35._8_4_ = -(uint)(auVar29._8_4_ == iVar61);
        auVar35._12_4_ = -(uint)(auVar29._12_4_ == iVar62);
        auVar73._4_4_ = auVar35._4_4_;
        auVar73._0_4_ = auVar35._4_4_;
        auVar73._8_4_ = auVar35._12_4_;
        auVar73._12_4_ = auVar35._12_4_;
        auVar29 = pshuflw(auVar35,auVar73,0xe8);
        auVar74._4_4_ = auVar57._4_4_;
        auVar74._0_4_ = auVar57._4_4_;
        auVar74._8_4_ = auVar57._12_4_;
        auVar74._12_4_ = auVar57._12_4_;
        auVar59 = pshuflw(auVar57,auVar74,0xe8);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29 & auVar63,(auVar59 | auVar29 & auVar63) ^ auVar7);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)pUVar24[4].uv + lVar25 + -0x18) = 0;
        }
        auVar21._4_4_ = auVar57._0_4_;
        auVar21._0_4_ = auVar57._0_4_;
        auVar21._8_4_ = auVar57._8_4_;
        auVar21._12_4_ = auVar57._8_4_;
        auVar74 = auVar73 & auVar21 | auVar74;
        auVar59 = packssdw(auVar74,auVar74);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29,auVar59 ^ auVar8);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._12_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[4].uv + lVar25 + -8) = 0;
        }
        auVar29 = auVar41 ^ auVar23;
        auVar58._0_4_ = -(uint)(iVar38 < auVar29._0_4_);
        auVar58._4_4_ = -(uint)(iVar40 < auVar29._4_4_);
        auVar58._8_4_ = -(uint)(iVar61 < auVar29._8_4_);
        auVar58._12_4_ = -(uint)(iVar62 < auVar29._12_4_);
        auVar75._4_4_ = auVar58._0_4_;
        auVar75._0_4_ = auVar58._0_4_;
        auVar75._8_4_ = auVar58._8_4_;
        auVar75._12_4_ = auVar58._8_4_;
        iVar38 = -(uint)(auVar29._4_4_ == iVar40);
        iVar40 = -(uint)(auVar29._12_4_ == iVar62);
        auVar60._4_4_ = iVar38;
        auVar60._0_4_ = iVar38;
        auVar60._8_4_ = iVar40;
        auVar60._12_4_ = iVar40;
        auVar36._4_4_ = auVar58._4_4_;
        auVar36._0_4_ = auVar58._4_4_;
        auVar36._8_4_ = auVar58._12_4_;
        auVar36._12_4_ = auVar58._12_4_;
        auVar36 = auVar60 & auVar75 | auVar36;
        auVar29 = packssdw(auVar36,auVar36);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar29 = packssdw(auVar29 ^ auVar9,auVar29 ^ auVar9);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)pUVar24[4].uv + lVar25 + 8) = 0;
        }
        auVar29 = pshufhw(auVar29,auVar75,0x84);
        in_XMM11 = pshufhw(auVar58,auVar60,0x84);
        in_XMM11 = in_XMM11 & auVar29;
        auVar22._4_4_ = auVar58._4_4_;
        auVar22._0_4_ = auVar58._4_4_;
        auVar22._8_4_ = auVar58._12_4_;
        auVar22._12_4_ = auVar58._12_4_;
        auVar29 = pshufhw(auVar29,auVar22,0x84);
        auVar37._8_4_ = 0xffffffff;
        auVar37._0_8_ = 0xffffffffffffffff;
        auVar37._12_4_ = 0xffffffff;
        auVar37 = (auVar29 | in_XMM11) ^ auVar37;
        auVar29 = packssdw(auVar37,auVar37);
        auVar29 = packsswb(auVar29,auVar29);
        if ((auVar29._14_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)pUVar24[5].uv + lVar25 + -0x20) = 0;
        }
        lVar27 = (long)DAT_0012f170;
        lVar42 = auVar49._8_8_;
        auVar49._0_8_ = auVar49._0_8_ + lVar27;
        lVar39 = DAT_0012f170._8_8_;
        auVar49._8_8_ = lVar42 + lVar39;
        lVar42 = auVar48._8_8_;
        auVar48._0_8_ = auVar48._0_8_ + lVar27;
        auVar48._8_8_ = lVar42 + lVar39;
        lVar42 = auVar47._8_8_;
        auVar47._0_8_ = auVar47._0_8_ + lVar27;
        auVar47._8_8_ = lVar42 + lVar39;
        lVar42 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + lVar27;
        auVar46._8_8_ = lVar42 + lVar39;
        lVar42 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + lVar27;
        auVar45._8_8_ = lVar42 + lVar39;
        lVar42 = auVar44._8_8_;
        auVar44._0_8_ = auVar44._0_8_ + lVar27;
        auVar44._8_8_ = lVar42 + lVar39;
        lVar42 = auVar43._8_8_;
        auVar43._0_8_ = auVar43._0_8_ + lVar27;
        auVar43._8_8_ = lVar42 + lVar39;
        lVar42 = auVar41._8_8_;
        auVar41._0_8_ = auVar41._0_8_ + lVar27;
        auVar41._8_8_ = lVar42 + lVar39;
        lVar25 = lVar25 + 0x100;
        auVar29 = _DAT_0012f170;
      } while ((ulong)(nuvalue + 0xfU >> 4) << 8 != lVar25);
    }
    return pUVar24;
  }
  luaM_toobig(L);
}

Assistant:

Udata *luaS_newudata (lua_State *L, size_t s, int nuvalue) {
  Udata *u;
  int i;
  GCObject *o;
  if (l_unlikely(s > MAX_SIZE - udatamemoffset(nuvalue)))
    luaM_toobig(L);
  o = luaC_newobj(L, LUA_VUSERDATA, sizeudata(nuvalue, s));
  u = gco2u(o);
  u->len = s;
  u->nuvalue = nuvalue;
  u->metatable = NULL;
  for (i = 0; i < nuvalue; i++)
    setnilvalue(&u->uv[i].uv);
  return u;
}